

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::NodeLoader::begin__bind_vertex_input
          (NodeLoader *this,bind_vertex_input__AttributeData *attributeData)

{
  FilePartLoader *this_00;
  TextureCoordinateBinding texCoordinateBinding;
  allocator<char> local_89;
  String local_88;
  undefined1 local_68 [24];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (this->mCurrentInstanceController != (InstanceController *)0x0 ||
      this->mCurrentInstanceGeometry != (InstanceGeometry *)0x0) {
    local_68._0_8_ = &PTR__TextureCoordinateBinding_009b0158;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_68._16_8_ = attributeData->input_set;
    local_50._M_p = (pointer)&local_40;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,attributeData->semantic,&local_89);
    std::__cxx11::string::_M_assign((string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    this_00 = (this->super_HelperLoaderBase).mHandlingFilePartLoader;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,attributeData->semantic,&local_89);
    local_68._8_8_ =
         IFilePartLoader::getTextureMapIdBySematic(&this_00->super_IFilePartLoader,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<COLLADAFW::TextureCoordinateBinding,COLLADAFW::TextureCoordinateBinding,std::_Identity<COLLADAFW::TextureCoordinateBinding>,std::less<COLLADAFW::TextureCoordinateBinding>,std::allocator<COLLADAFW::TextureCoordinateBinding>>
    ::_M_insert_unique<COLLADAFW::TextureCoordinateBinding_const&>
              ((_Rb_tree<COLLADAFW::TextureCoordinateBinding,COLLADAFW::TextureCoordinateBinding,std::_Identity<COLLADAFW::TextureCoordinateBinding>,std::less<COLLADAFW::TextureCoordinateBinding>,std::allocator<COLLADAFW::TextureCoordinateBinding>>
                *)&this->mCurrentTextureCoordinateBindings,(TextureCoordinateBinding *)local_68);
    local_68._0_8_ = &PTR__TextureCoordinateBinding_009b0158;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,
                      CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
    }
  }
  return true;
}

Assistant:

bool NodeLoader::begin__bind_vertex_input( const bind_vertex_input__AttributeData& attributeData )
	{
        if ( mCurrentInstanceGeometry || mCurrentInstanceController )
        {
            COLLADAFW::TextureCoordinateBinding texCoordinateBinding;
            texCoordinateBinding.setSetIndex ( (size_t)attributeData.input_set );
            texCoordinateBinding.setSemantic( attributeData.semantic );
            texCoordinateBinding.setTextureMapId ( getHandlingFilePartLoader()->getTextureMapIdBySematic( attributeData.semantic ) );
            mCurrentTextureCoordinateBindings.insert(texCoordinateBinding);
        }
		return true;
	}